

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

ERROR_HANDLE error_create(char *condition_value)

{
  int iVar1;
  ERROR_INSTANCE_TAG EVar2;
  AMQP_VALUE item_value;
  undefined4 local_24;
  int result;
  AMQP_VALUE condition_amqp_value;
  ERROR_INSTANCE *error_instance;
  char *condition_value_local;
  
  condition_amqp_value = (AMQP_VALUE)malloc(8);
  if (condition_amqp_value != (AMQP_VALUE)0x0) {
    EVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x1d);
    *(AMQP_VALUE *)condition_amqp_value = EVar2.composite_value;
    if (*(AMQP_VALUE *)condition_amqp_value == (AMQP_VALUE)0x0) {
      free(condition_amqp_value);
      condition_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_24 = 0;
      item_value = amqpvalue_create_symbol(condition_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)condition_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_24 = 0x91;
      }
      amqpvalue_destroy(item_value);
      if (local_24 != 0) {
        error_destroy((ERROR_HANDLE)condition_amqp_value);
        condition_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (ERROR_HANDLE)condition_amqp_value;
}

Assistant:

ERROR_HANDLE error_create(const char* condition_value)
{
    ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)malloc(sizeof(ERROR_INSTANCE));
    if (error_instance != NULL)
    {
        error_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(29);
        if (error_instance->composite_value == NULL)
        {
            free(error_instance);
            error_instance = NULL;
        }
        else
        {
            AMQP_VALUE condition_amqp_value;
            int result = 0;

            condition_amqp_value = amqpvalue_create_symbol(condition_value);
            if ((result == 0) && (amqpvalue_set_composite_item(error_instance->composite_value, 0, condition_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(condition_amqp_value);
            if (result != 0)
            {
                error_destroy(error_instance);
                error_instance = NULL;
            }
        }
    }

    return error_instance;
}